

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UChar * __thiscall
icu_63::Normalizer2Impl::makeFCD
          (Normalizer2Impl *this,UChar *src,UChar *limit,ReorderingBuffer *buffer,
          UErrorCode *errorCode)

{
  UChar UVar1;
  UBool UVar2;
  byte bVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  long lVar6;
  UChar *pUVar7;
  uint uVar8;
  UChar *pUVar9;
  uint uVar10;
  uint c;
  UChar *prevSrc;
  UChar *local_50;
  UChar *local_48;
  
  local_50 = src;
  uVar10 = 0;
  if (limit == (UChar *)0x0) {
    lVar6 = 2;
    pUVar9 = src + -2;
    do {
      pUVar7 = pUVar9;
      pUVar9 = pUVar7 + 1;
      lVar6 = lVar6 + -2;
      if (pUVar7[2] == L'\0') break;
    } while ((ushort)pUVar7[2] < (ushort)this->minLcccCP);
    pUVar7 = pUVar7 + 2;
    if (buffer != (ReorderingBuffer *)0x0 && lVar6 != 0) {
      ReorderingBuffer::appendZeroCC(buffer,src,pUVar7,errorCode);
    }
    if (U_ZERO_ERROR < *errorCode) {
      return pUVar7;
    }
    uVar10 = 0;
    if (src < pUVar7) {
      uVar4 = getFCD16(this,(uint)(ushort)*pUVar9);
      local_50 = pUVar9;
      if (uVar4 < 2) {
        local_50 = pUVar7;
      }
      uVar10 = (uint)uVar4;
    }
    limit = u_strchr_63(pUVar7,L'\0');
    src = pUVar7;
  }
joined_r0x0017c173:
  pUVar9 = src;
  if (src == limit) {
    return src;
  }
  do {
    UVar1 = *pUVar9;
    c = (uint)(ushort)UVar1;
    if ((ushort)UVar1 < (ushort)this->minLcccCP) {
      uVar10 = ~(uint)(ushort)UVar1;
      pUVar9 = pUVar9 + 1;
    }
    else if ((this->smallFCD[(ushort)UVar1 >> 8] == 0) ||
            ((ushort)((ushort)(1 << ((byte)UVar1 >> 5)) & (ushort)this->smallFCD[(ushort)UVar1 >> 8]
                     ) == 0)) {
      pUVar9 = pUVar9 + 1;
      uVar10 = 0;
    }
    else {
      if ((((UVar1 & 0xfc00U) == 0xd800) && (pUVar9 + 1 != limit)) &&
         (uVar8 = (uint)(ushort)pUVar9[1], (uVar8 & 0xfc00) == 0xdc00)) {
        c = (uint)(ushort)UVar1 * 0x400 + uVar8 + 0xfca02400;
      }
      uVar4 = getFCD16FromNormData(this,c);
      uVar8 = (uint)uVar4;
      if (0xff < uVar8) break;
      uVar10 = (uint)uVar4;
      pUVar9 = pUVar9 + (2 - (c < 0x10000));
    }
    if (pUVar9 == limit) {
      if (buffer == (ReorderingBuffer *)0x0) {
        return pUVar9;
      }
      if (pUVar9 == src) {
        return pUVar9;
      }
      ReorderingBuffer::appendZeroCC(buffer,src,pUVar9,errorCode);
      return pUVar9;
    }
  } while( true );
  if (pUVar9 == src) {
    bVar3 = (byte)uVar10;
    local_48 = src;
  }
  else {
    if ((buffer != (ReorderingBuffer *)0x0) &&
       (UVar2 = ReorderingBuffer::appendZeroCC(buffer,src,pUVar9,errorCode), UVar2 == '\0')) {
      return pUVar9;
    }
    local_48 = pUVar9;
    if ((int)uVar10 < 0) {
      bVar3 = 0;
      local_50 = pUVar9;
      if ((uint)(ushort)this->minDecompNoCP <= ~uVar10) {
        uVar5 = getFCD16FromNormData(this,~uVar10);
        local_50 = pUVar9 + ((ulong)(uVar5 < 2) - 1);
        bVar3 = (byte)uVar5;
      }
    }
    else {
      local_50 = pUVar9 + -1;
      if ((((pUVar9[-1] & 0xfc00U) == 0xdc00) && (src < local_50)) &&
         ((pUVar9[-2] & 0xfc00U) == 0xd800)) {
        local_50 = pUVar9 + -2;
        uVar5 = getFCD16FromNormData
                          (this,(uint)(ushort)pUVar9[-1] + (uint)(ushort)pUVar9[-2] * 0x400 +
                                -0x35fdc00);
        uVar10 = (uint)uVar5;
      }
      if (uVar10 < 2) {
        local_50 = pUVar9;
      }
      bVar3 = (byte)uVar10;
    }
  }
  src = pUVar9 + (2 - (c < 0x10000));
  if (uVar4 >> 8 < (ushort)bVar3) {
    if (buffer == (ReorderingBuffer *)0x0) {
      return local_50;
    }
    ReorderingBuffer::removeSuffix(buffer,(int32_t)((ulong)((long)local_48 - (long)local_50) >> 1));
    src = findNextFCDBoundary(this,src,limit);
    decomposeShort(this,local_50,src,'\0','\0',buffer,errorCode);
    local_50 = src;
    uVar10 = 0;
    if (U_ZERO_ERROR < *errorCode) {
      return src;
    }
  }
  else {
    if ((uVar4 & 0xfe) == 0) {
      local_50 = src;
    }
    uVar10 = uVar8;
    if ((buffer != (ReorderingBuffer *)0x0) &&
       (UVar2 = ReorderingBuffer::appendZeroCC(buffer,c,errorCode), UVar2 == '\0')) {
      return src;
    }
  }
  goto joined_r0x0017c173;
}

Assistant:

const UChar *
Normalizer2Impl::makeFCD(const UChar *src, const UChar *limit,
                         ReorderingBuffer *buffer,
                         UErrorCode &errorCode) const {
    // Tracks the last FCD-safe boundary, before lccc=0 or after properly-ordered tccc<=1.
    // Similar to the prevBoundary in the compose() implementation.
    const UChar *prevBoundary=src;
    int32_t prevFCD16=0;
    if(limit==NULL) {
        src=copyLowPrefixFromNulTerminated(src, minLcccCP, buffer, errorCode);
        if(U_FAILURE(errorCode)) {
            return src;
        }
        if(prevBoundary<src) {
            prevBoundary=src;
            // We know that the previous character's lccc==0.
            // Fetching the fcd16 value was deferred for this below-U+0300 code point.
            prevFCD16=getFCD16(*(src-1));
            if(prevFCD16>1) {
                --prevBoundary;
            }
        }
        limit=u_strchr(src, 0);
    }

    // Note: In this function we use buffer->appendZeroCC() because we track
    // the lead and trail combining classes here, rather than leaving it to
    // the ReorderingBuffer.
    // The exception is the call to decomposeShort() which uses the buffer
    // in the normal way.

    const UChar *prevSrc;
    UChar32 c=0;
    uint16_t fcd16=0;

    for(;;) {
        // count code units with lccc==0
        for(prevSrc=src; src!=limit;) {
            if((c=*src)<minLcccCP) {
                prevFCD16=~c;
                ++src;
            } else if(!singleLeadMightHaveNonZeroFCD16(c)) {
                prevFCD16=0;
                ++src;
            } else {
                if(U16_IS_LEAD(c)) {
                    UChar c2;
                    if((src+1)!=limit && U16_IS_TRAIL(c2=src[1])) {
                        c=U16_GET_SUPPLEMENTARY(c, c2);
                    }
                }
                if((fcd16=getFCD16FromNormData(c))<=0xff) {
                    prevFCD16=fcd16;
                    src+=U16_LENGTH(c);
                } else {
                    break;
                }
            }
        }
        // copy these code units all at once
        if(src!=prevSrc) {
            if(buffer!=NULL && !buffer->appendZeroCC(prevSrc, src, errorCode)) {
                break;
            }
            if(src==limit) {
                break;
            }
            prevBoundary=src;
            // We know that the previous character's lccc==0.
            if(prevFCD16<0) {
                // Fetching the fcd16 value was deferred for this below-minLcccCP code point.
                UChar32 prev=~prevFCD16;
                if(prev<minDecompNoCP) {
                    prevFCD16=0;
                } else {
                    prevFCD16=getFCD16FromNormData(prev);
                    if(prevFCD16>1) {
                        --prevBoundary;
                    }
                }
            } else {
                const UChar *p=src-1;
                if(U16_IS_TRAIL(*p) && prevSrc<p && U16_IS_LEAD(*(p-1))) {
                    --p;
                    // Need to fetch the previous character's FCD value because
                    // prevFCD16 was just for the trail surrogate code point.
                    prevFCD16=getFCD16FromNormData(U16_GET_SUPPLEMENTARY(p[0], p[1]));
                    // Still known to have lccc==0 because its lead surrogate unit had lccc==0.
                }
                if(prevFCD16>1) {
                    prevBoundary=p;
                }
            }
            // The start of the current character (c).
            prevSrc=src;
        } else if(src==limit) {
            break;
        }

        src+=U16_LENGTH(c);
        // The current character (c) at [prevSrc..src[ has a non-zero lead combining class.
        // Check for proper order, and decompose locally if necessary.
        if((prevFCD16&0xff)<=(fcd16>>8)) {
            // proper order: prev tccc <= current lccc
            if((fcd16&0xff)<=1) {
                prevBoundary=src;
            }
            if(buffer!=NULL && !buffer->appendZeroCC(c, errorCode)) {
                break;
            }
            prevFCD16=fcd16;
            continue;
        } else if(buffer==NULL) {
            return prevBoundary;  // quick check "no"
        } else {
            /*
             * Back out the part of the source that we copied or appended
             * already but is now going to be decomposed.
             * prevSrc is set to after what was copied/appended.
             */
            buffer->removeSuffix((int32_t)(prevSrc-prevBoundary));
            /*
             * Find the part of the source that needs to be decomposed,
             * up to the next safe boundary.
             */
            src=findNextFCDBoundary(src, limit);
            /*
             * The source text does not fulfill the conditions for FCD.
             * Decompose and reorder a limited piece of the text.
             */
            decomposeShort(prevBoundary, src, FALSE, FALSE, *buffer, errorCode);
            if (U_FAILURE(errorCode)) {
                break;
            }
            prevBoundary=src;
            prevFCD16=0;
        }
    }
    return src;
}